

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::GetOuterVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *this_00;
  SQObjectValue *pSVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQObjectPtr local_70;
  SQObjectPtr local_60;
  SQOuterVar local_50;
  
  SVar3 = (this->_outervalues)._size;
  SVar4 = 0;
  if ((long)SVar3 < 1) {
    SVar3 = SVar4;
  }
  pSVar2 = &(((this->_outervalues)._vals)->_name).super_SQObject._unVal;
  for (; SVar3 != SVar4; SVar4 = SVar4 + 1) {
    if (pSVar2->pTable == (name->_unVal).pTable) {
      return SVar4;
    }
    pSVar2 = pSVar2 + 5;
  }
  this_00 = this->_parent;
  SVar5 = -1;
  if (this_00 != (SQFuncState *)0x0) {
    local_60.super_SQObject._unVal.nInteger = GetLocalVariable(this_00,name);
    if (local_60.super_SQObject._unVal.pTable == (SQTable *)0xffffffffffffffff) {
      local_60.super_SQObject._unVal.nInteger = GetOuterVariable(this_00,name);
      if (local_60.super_SQObject._unVal.pTable == (SQTable *)0xffffffffffffffff) {
        return -1;
      }
      local_70.super_SQObject._type = name->_type;
      local_70.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
      if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_60.super_SQObject._type = OT_INTEGER;
      SQOuterVar::SQOuterVar(&local_50,&local_70,&local_60,otOUTER);
      sqvector<SQOuterVar>::push_back(&this->_outervalues,&local_50);
    }
    else {
      (this_00->_vlocals)._vals[local_60.super_SQObject._unVal.nInteger]._end_op =
           0xffffffffffffffff;
      this_00->_outers = this_00->_outers + 1;
      local_70.super_SQObject._type = name->_type;
      local_70.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
      if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_60.super_SQObject._type = OT_INTEGER;
      SQOuterVar::SQOuterVar(&local_50,&local_70,&local_60,otLOCAL);
      sqvector<SQOuterVar>::push_back(&this->_outervalues,&local_50);
    }
    SQOuterVar::~SQOuterVar(&local_50);
    SQObjectPtr::~SQObjectPtr(&local_60);
    SQObjectPtr::~SQObjectPtr(&local_70);
    SVar5 = (this->_outervalues)._size - 1;
  }
  return SVar5;
}

Assistant:

SQInteger SQFuncState::GetOuterVariable(const SQObject &name)
{
    SQInteger outers = _outervalues.size();
    for(SQInteger i = 0; i<outers; i++) {
        if(_string(_outervalues[i]._name) == _string(name))
            return i;
    }
    SQInteger pos=-1;
    if(_parent) {
        pos = _parent->GetLocalVariable(name);
        if(pos == -1) {
            pos = _parent->GetOuterVariable(name);
            if(pos != -1) {
                _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otOUTER)); //local
                return _outervalues.size() - 1;
            }
        }
        else {
            _parent->MarkLocalAsOuter(pos);
            _outervalues.push_back(SQOuterVar(name,SQObjectPtr(SQInteger(pos)),otLOCAL)); //local
            return _outervalues.size() - 1;


        }
    }
    return -1;
}